

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall
BarrierTest_BasicPhasing_Test::~BarrierTest_BasicPhasing_Test(BarrierTest_BasicPhasing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BarrierTest, BasicPhasing)
{
  SETUP_STEPTEST;
  yamc::barrier<> barrier{3};
  yamc::test::task_runner(
    3,
    [&](std::size_t id) {
      switch (id) {
      case 0:
        EXPECT_STEP(1);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      case 1:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(2);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      case 2:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(3);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      }
    }
  );
}